

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<char> * __thiscall irr::core::string<char>::operator=(string<char> *this,char *c)

{
  char *pcVar1;
  char *pcVar2;
  int local_3c;
  s32 l;
  char *oldArray;
  char *p;
  s32 len;
  char *c_local;
  string<char> *this_local;
  
  if (c == (char *)0x0) {
    if (this->array == (char *)0x0) {
      pcVar1 = (char *)operator_new__(1);
      this->array = pcVar1;
      this->allocated = 1;
      this->used = 1;
    }
    *this->array = '\0';
  }
  else if (c != this->array) {
    p._4_4_ = 0;
    for (oldArray = c; *oldArray != '\0'; oldArray = oldArray + 1) {
      p._4_4_ = p._4_4_ + 1;
    }
    pcVar1 = this->array;
    this->used = p._4_4_ + 1;
    this->allocated = p._4_4_ + 1;
    pcVar2 = (char *)operator_new__((long)this->used);
    this->array = pcVar2;
    for (local_3c = 0; local_3c < p._4_4_ + 1; local_3c = local_3c + 1) {
      this->array[local_3c] = c[local_3c];
    }
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}